

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O3

ArrayWithPreallocation<soul::pool_ref<soul::heart::Expression>,_4UL> * __thiscall
soul::heart::Parser::
parseOptionalBranchArgs<soul::ArrayWithPreallocation<soul::pool_ref<soul::heart::Expression>,4ul>>
          (ArrayWithPreallocation<soul::pool_ref<soul::heart::Expression>,_4UL>
           *__return_storage_ptr__,Parser *this,FunctionParseState *state)

{
  size_t sVar1;
  bool bVar2;
  Expression *pEVar3;
  
  __return_storage_ptr__->items = (pool_ref<soul::heart::Expression> *)__return_storage_ptr__->space
  ;
  __return_storage_ptr__->numActive = 0;
  __return_storage_ptr__->numAllocated = 4;
  bVar2 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          ::matchIf<soul::TokenType>
                    (&this->
                      super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                     ,(TokenType)0x27f6d5);
  if ((bVar2) &&
     (bVar2 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
              ::matchIf<soul::TokenType>
                        (&this->
                          super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                         ,(TokenType)0x27d2c7), !bVar2)) {
    do {
      pEVar3 = parseExpression(this,state);
      ArrayWithPreallocation<soul::pool_ref<soul::heart::Expression>,_4UL>::reserve
                (__return_storage_ptr__,__return_storage_ptr__->numActive + 1);
      sVar1 = __return_storage_ptr__->numActive;
      __return_storage_ptr__->items[sVar1].object = pEVar3;
      __return_storage_ptr__->numActive = sVar1 + 1;
      bVar2 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
              ::matchIf<soul::TokenType>
                        (&this->
                          super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                         ,(TokenType)0x259fab);
    } while (bVar2);
    Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
    expect<soul::TokenType>
              (&this->
                super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
               ,(TokenType)0x27d2c7);
  }
  return __return_storage_ptr__;
}

Assistant:

ArgListType parseOptionalBranchArgs (const FunctionParseState& state)
    {
        heart::FunctionCall::ArgListType args;

        if (matchIf (HEARTOperator::openParen))
        {
            if (! matchIf (HEARTOperator::closeParen))
            {
                for (;;)
                {
                    auto& arg = parseExpression (state);
                    args.push_back (arg);

                    if (matchIf (HEARTOperator::comma))
                        continue;

                    expect (HEARTOperator::closeParen);
                    break;
                }
            }
        }

        return args;
    }